

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O0

uint32_t * __thiscall
vsencoding::VSEncodingBlocks::decodeVS
          (VSEncodingBlocks *this,uint32_t len,uint32_t *in,uint32_t *out,uint32_t *aux)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 *puVar8;
  uint *puVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  undefined1 (*in_RCX) [16];
  int *in_RDX;
  uint in_ESI;
  long in_R8;
  uint32_t *end;
  uint32_t K;
  uint32_t B;
  uint32_t *pblk [16];
  uint32_t *addr;
  uint32_t nblk;
  int ntotal;
  long alStack_b8 [16];
  uint *local_38;
  uint local_30;
  int local_2c;
  long local_28;
  undefined1 (*local_20) [16];
  uint *local_18;
  uint local_c;
  
  local_18 = (uint *)(in_RDX + 1);
  local_2c = *in_RDX;
  local_38 = (uint *)(in_RDX + 1 + local_2c);
  local_28 = in_R8;
  local_20 = in_RCX;
  local_c = in_ESI;
  while (iVar10 = local_2c, local_2c = local_2c + -1, 0 < iVar10) {
    uVar11 = *local_18 & 0xf;
    local_30 = *local_18 >> 4;
    local_18 = local_18 + 1;
    (**(code **)(__vseblocks_unpack + (ulong)uVar11 * 8))(local_28,local_38,local_30);
    alStack_b8[uVar11] = local_28;
    local_28 = local_28 + (ulong)local_30 * 4;
    local_38 = local_38 +
               (local_30 * *(int *)(__vseblocks_possLogs + (ulong)uVar11 * 4) + 0x1f >> 5);
  }
  puVar8 = *local_20;
  do {
    uVar11 = *local_38 >> 0x1c;
    uVar12 = *local_38 >> 0x18 & 0xf;
    if (uVar11 == 0) {
      *local_20 = (undefined1  [16])0x0;
      local_20[1] = (undefined1  [16])0x0;
      local_20[2] = (undefined1  [16])0x0;
      local_20[3] = (undefined1  [16])0x0;
      local_20[4] = (undefined1  [16])0x0;
      local_20[5] = (undefined1  [16])0x0;
      local_20[6] = (undefined1  [16])0x0;
      local_20[7] = (undefined1  [16])0x0;
      local_20 = (undefined1 (*) [16])
                 (*local_20 + (ulong)*(uint *)(__vseblocks_posszLens + (ulong)uVar12 * 4) * 4);
    }
    else {
      uVar1 = ((undefined8 *)alStack_b8[uVar11])[1];
      uVar2 = *(undefined8 *)(alStack_b8[uVar11] + 0x10);
      uVar3 = *(undefined8 *)(alStack_b8[uVar11] + 0x18);
      uVar4 = *(undefined8 *)(alStack_b8[uVar11] + 0x20);
      uVar5 = *(undefined8 *)(alStack_b8[uVar11] + 0x28);
      uVar6 = *(undefined8 *)(alStack_b8[uVar11] + 0x30);
      uVar7 = *(undefined8 *)(alStack_b8[uVar11] + 0x38);
      *(undefined8 *)*local_20 = *(undefined8 *)alStack_b8[uVar11];
      *(undefined8 *)(*local_20 + 8) = uVar1;
      *(undefined8 *)local_20[1] = uVar2;
      *(undefined8 *)(local_20[1] + 8) = uVar3;
      *(undefined8 *)local_20[2] = uVar4;
      *(undefined8 *)(local_20[2] + 8) = uVar5;
      *(undefined8 *)local_20[3] = uVar6;
      *(undefined8 *)(local_20[3] + 8) = uVar7;
      alStack_b8[uVar11] =
           alStack_b8[uVar11] + (ulong)*(uint *)(__vseblocks_possLens + (ulong)uVar12 * 4) * 4;
      local_20 = (undefined1 (*) [16])
                 (*local_20 + (ulong)*(uint *)(__vseblocks_possLens + (ulong)uVar12 * 4) * 4);
    }
    uVar11 = *local_38 >> 0x14 & 0xf;
    uVar12 = *local_38 >> 0x10 & 0xf;
    if (uVar11 == 0) {
      *local_20 = (undefined1  [16])0x0;
      local_20[1] = (undefined1  [16])0x0;
      local_20[2] = (undefined1  [16])0x0;
      local_20[3] = (undefined1  [16])0x0;
      local_20[4] = (undefined1  [16])0x0;
      local_20[5] = (undefined1  [16])0x0;
      local_20[6] = (undefined1  [16])0x0;
      local_20[7] = (undefined1  [16])0x0;
      local_20 = (undefined1 (*) [16])
                 (*local_20 + (ulong)*(uint *)(__vseblocks_posszLens + (ulong)uVar12 * 4) * 4);
    }
    else {
      uVar1 = ((undefined8 *)alStack_b8[uVar11])[1];
      uVar2 = *(undefined8 *)(alStack_b8[uVar11] + 0x10);
      uVar3 = *(undefined8 *)(alStack_b8[uVar11] + 0x18);
      uVar4 = *(undefined8 *)(alStack_b8[uVar11] + 0x20);
      uVar5 = *(undefined8 *)(alStack_b8[uVar11] + 0x28);
      uVar6 = *(undefined8 *)(alStack_b8[uVar11] + 0x30);
      uVar7 = *(undefined8 *)(alStack_b8[uVar11] + 0x38);
      *(undefined8 *)*local_20 = *(undefined8 *)alStack_b8[uVar11];
      *(undefined8 *)(*local_20 + 8) = uVar1;
      *(undefined8 *)local_20[1] = uVar2;
      *(undefined8 *)(local_20[1] + 8) = uVar3;
      *(undefined8 *)local_20[2] = uVar4;
      *(undefined8 *)(local_20[2] + 8) = uVar5;
      *(undefined8 *)local_20[3] = uVar6;
      *(undefined8 *)(local_20[3] + 8) = uVar7;
      alStack_b8[uVar11] =
           alStack_b8[uVar11] + (ulong)*(uint *)(__vseblocks_possLens + (ulong)uVar12 * 4) * 4;
      local_20 = (undefined1 (*) [16])
                 (*local_20 + (ulong)*(uint *)(__vseblocks_possLens + (ulong)uVar12 * 4) * 4);
    }
    uVar11 = *local_38 >> 0xc & 0xf;
    uVar12 = *local_38 >> 8 & 0xf;
    if (uVar11 == 0) {
      *local_20 = (undefined1  [16])0x0;
      local_20[1] = (undefined1  [16])0x0;
      local_20[2] = (undefined1  [16])0x0;
      local_20[3] = (undefined1  [16])0x0;
      local_20[4] = (undefined1  [16])0x0;
      local_20[5] = (undefined1  [16])0x0;
      local_20[6] = (undefined1  [16])0x0;
      local_20[7] = (undefined1  [16])0x0;
      local_20 = (undefined1 (*) [16])
                 (*local_20 + (ulong)*(uint *)(__vseblocks_posszLens + (ulong)uVar12 * 4) * 4);
    }
    else {
      uVar1 = ((undefined8 *)alStack_b8[uVar11])[1];
      uVar2 = *(undefined8 *)(alStack_b8[uVar11] + 0x10);
      uVar3 = *(undefined8 *)(alStack_b8[uVar11] + 0x18);
      uVar4 = *(undefined8 *)(alStack_b8[uVar11] + 0x20);
      uVar5 = *(undefined8 *)(alStack_b8[uVar11] + 0x28);
      uVar6 = *(undefined8 *)(alStack_b8[uVar11] + 0x30);
      uVar7 = *(undefined8 *)(alStack_b8[uVar11] + 0x38);
      *(undefined8 *)*local_20 = *(undefined8 *)alStack_b8[uVar11];
      *(undefined8 *)(*local_20 + 8) = uVar1;
      *(undefined8 *)local_20[1] = uVar2;
      *(undefined8 *)(local_20[1] + 8) = uVar3;
      *(undefined8 *)local_20[2] = uVar4;
      *(undefined8 *)(local_20[2] + 8) = uVar5;
      *(undefined8 *)local_20[3] = uVar6;
      *(undefined8 *)(local_20[3] + 8) = uVar7;
      alStack_b8[uVar11] =
           alStack_b8[uVar11] + (ulong)*(uint *)(__vseblocks_possLens + (ulong)uVar12 * 4) * 4;
      local_20 = (undefined1 (*) [16])
                 (*local_20 + (ulong)*(uint *)(__vseblocks_possLens + (ulong)uVar12 * 4) * 4);
    }
    puVar9 = local_38;
    uVar11 = *local_38 >> 4 & 0xf;
    local_38 = local_38 + 1;
    uVar12 = *puVar9 & 0xf;
    if (uVar11 == 0) {
      *local_20 = (undefined1  [16])0x0;
      local_20[1] = (undefined1  [16])0x0;
      local_20[2] = (undefined1  [16])0x0;
      local_20[3] = (undefined1  [16])0x0;
      local_20[4] = (undefined1  [16])0x0;
      local_20[5] = (undefined1  [16])0x0;
      local_20[6] = (undefined1  [16])0x0;
      local_20[7] = (undefined1  [16])0x0;
      local_20 = (undefined1 (*) [16])
                 (*local_20 + (ulong)*(uint *)(__vseblocks_posszLens + (ulong)uVar12 * 4) * 4);
    }
    else {
      uVar1 = ((undefined8 *)alStack_b8[uVar11])[1];
      uVar2 = *(undefined8 *)(alStack_b8[uVar11] + 0x10);
      uVar3 = *(undefined8 *)(alStack_b8[uVar11] + 0x18);
      uVar4 = *(undefined8 *)(alStack_b8[uVar11] + 0x20);
      uVar5 = *(undefined8 *)(alStack_b8[uVar11] + 0x28);
      uVar6 = *(undefined8 *)(alStack_b8[uVar11] + 0x30);
      uVar7 = *(undefined8 *)(alStack_b8[uVar11] + 0x38);
      *(undefined8 *)*local_20 = *(undefined8 *)alStack_b8[uVar11];
      *(undefined8 *)(*local_20 + 8) = uVar1;
      *(undefined8 *)local_20[1] = uVar2;
      *(undefined8 *)(local_20[1] + 8) = uVar3;
      *(undefined8 *)local_20[2] = uVar4;
      *(undefined8 *)(local_20[2] + 8) = uVar5;
      *(undefined8 *)local_20[3] = uVar6;
      *(undefined8 *)(local_20[3] + 8) = uVar7;
      alStack_b8[uVar11] =
           alStack_b8[uVar11] + (ulong)*(uint *)(__vseblocks_possLens + (ulong)uVar12 * 4) * 4;
      local_20 = (undefined1 (*) [16])
                 (*local_20 + (ulong)*(uint *)(__vseblocks_possLens + (ulong)uVar12 * 4) * 4);
    }
  } while (local_20 < (undefined1 (*) [16])(puVar8 + (ulong)local_c * 4));
  return local_38;
}

Assistant:

inline const uint32_t *VSEncodingBlocks::decodeVS(uint32_t len,
                       const uint32_t *in, uint32_t *out, uint32_t *aux) {
  int ntotal;
  uint32_t nblk;
  const uint32_t *addr;
  uint32_t *pblk[VSEBLOCKS_LOGS_LEN];
  uint32_t B;
  uint32_t K;
  uint32_t *end;

  //__validate(in, len);

  ntotal = *in++;
  addr = in + ntotal;

  while (ntotal-- > 0) {
    B = (*in) & (VSEBLOCKS_LOGS_LEN - 1);
    nblk = *(in++) >> VSEBLOCKS_LOGLEN;

    /* Do unpacking */
    (__vseblocks_unpack[B])(aux, addr, nblk);

    pblk[B] = aux;
    aux += nblk;
    addr += (nblk * __vseblocks_possLogs[B] + 31) / 32;
  }

  /*
   * FIXME: We assume that a 32-bit block is processed in a loop here.
   * I might think some amount of 32-bit blocks are processed simutaneously.
   */
  end = out + len;

  do {
    /* Permuting integers with a first 8-bit */
    B = (*addr) >> (VSEBLOCKS_LOGDESC * 3 + VSEBLOCKS_LOGLEN);
    K = (((*addr) >> (VSEBLOCKS_LOGDESC * 3)) & (VSEBLOCKS_LENS_LEN - 1));

    if (B) {
      /*
             * NOTICE: If a max value in __vseblocks_possLens[] is
             * over 16, a code below needs to be fixed.
             * __vseblocks_copy16() just copies 16 values each.
             */ __vseblocks_copy16(pblk[B], out);
      pblk[B] += __vseblocks_possLens[K];
      out += __vseblocks_possLens[K];
    } else {
      /* FIXME: Is it better to do memcpy() firstly? */ __vseblocks_zero32(out);
      out += __vseblocks_posszLens[K];
    }

    /* Permuting integers with a second 8-bit */
    B = ((*addr) >> (VSEBLOCKS_LOGDESC * 2 + VSEBLOCKS_LOGLEN)) &
        (VSEBLOCKS_LOGS_LEN - 1);
    K = (((*addr) >> (VSEBLOCKS_LOGDESC * 2)) & (VSEBLOCKS_LENS_LEN - 1));

    if (B) {
      __vseblocks_copy16(pblk[B], out);
      pblk[B] += __vseblocks_possLens[K];
      out += __vseblocks_possLens[K];
    } else {
      __vseblocks_zero32(out);
      out += __vseblocks_posszLens[K];
    }

    /* Permuting integers with a third 8-bit */
    B = ((*addr) >> (VSEBLOCKS_LOGDESC + VSEBLOCKS_LOGLEN)) &
        (VSEBLOCKS_LOGS_LEN - 1);
    K = (((*addr) >> VSEBLOCKS_LOGDESC) & (VSEBLOCKS_LENS_LEN - 1));

    if (B) {
      __vseblocks_copy16(pblk[B], out);
      pblk[B] += __vseblocks_possLens[K];
      out += __vseblocks_possLens[K];
    } else {
      __vseblocks_zero32(out);
      out += __vseblocks_posszLens[K];
    }

    /* Permuting integers with a fourth 8-bit */
    B = ((*addr) >> VSEBLOCKS_LOGLEN) & (VSEBLOCKS_LOGS_LEN - 1);
    K = (*addr++) & (VSEBLOCKS_LENS_LEN - 1);

    if (B) {
      __vseblocks_copy16(pblk[B], out);
      pblk[B] += __vseblocks_possLens[K];
      out += __vseblocks_possLens[K];
    } else {
      __vseblocks_zero32(out);
      out += __vseblocks_posszLens[K];
    }
  } while (end > out);
  return addr;
}